

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::IRContext,spv_target_env&,std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>&>
          (spvtools *this,spv_target_env *args,
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
          *args_1)

{
  spv_target_env env;
  IRContext *this_00;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_40;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_20
  ;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
  *args_local_1;
  spv_target_env *args_local;
  
  local_20 = args_1;
  args_local_1 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                  *)args;
  args_local = (spv_target_env *)this;
  this_00 = (IRContext *)::operator_new(0x250);
  env = *(spv_target_env *)&(args_local_1->super__Function_base)._M_functor;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_40,local_20);
  opt::IRContext::IRContext(this_00,env,&local_40);
  std::unique_ptr<spvtools::opt::IRContext,std::default_delete<spvtools::opt::IRContext>>::
  unique_ptr<std::default_delete<spvtools::opt::IRContext>,void>
            ((unique_ptr<spvtools::opt::IRContext,std::default_delete<spvtools::opt::IRContext>> *)
             this,this_00);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_40);
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}